

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcCrossProductsStates
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *tipStates,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  int k;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  ulong uVar26;
  double *pdVar27;
  int k_1;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  array<double,_16UL> withinPattern;
  array<double,_16UL> acrossPatterns;
  double *local_158;
  value_type_conflict local_138;
  double local_130 [16];
  array<double,_16UL> local_b0;
  
  local_130[0] = 0.0;
  std::array<double,_16UL>::fill(&local_b0,local_130);
  iVar22 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
  local_158 = preOrderPartial;
  for (lVar24 = 0; lVar24 < iVar22; lVar24 = lVar24 + 1) {
    local_138 = 0.0;
    std::array<double,_16UL>::fill((array<double,_16UL> *)local_130,&local_138);
    iVar22 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    uVar16 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    iVar17 = tipStates[lVar24];
    lVar23 = (long)iVar22;
    if (iVar17 < (this->super_BeagleCPUImpl<double,_1,_0>).kStateCount) {
      iVar19 = iVar17 + 4;
      auVar29 = ZEXT816(0);
      uVar26 = 0;
      iVar20 = iVar17 + 0xc;
      pdVar25 = local_158;
      while ((~((int)uVar16 >> 0x1f) & uVar16) != uVar26) {
        dVar1 = categoryWeights[uVar26];
        auVar36._8_8_ = 0;
        auVar36._0_8_ = dVar1;
        dVar2 = categoryRates[uVar26];
        uVar26 = uVar26 + 1;
        dVar3 = *pdVar25;
        dVar4 = pdVar25[1];
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pdVar25[iVar17];
        auVar29 = vfmadd231sd_fma(auVar29,auVar36,auVar7);
        dVar5 = pdVar25[2];
        dVar6 = pdVar25[3];
        pdVar25 = pdVar25 + lVar23 * 4;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_130[iVar17];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = edgeLength * dVar2;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = dVar1 * dVar3;
        auVar18 = vfmadd213sd_fma(auVar41,auVar31,auVar8);
        local_130[iVar17] = auVar18._0_8_;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_130[iVar19];
        auVar44._8_8_ = 0;
        auVar44._0_8_ = dVar1 * dVar4;
        auVar18 = vfmadd213sd_fma(auVar44,auVar31,auVar9);
        local_130[iVar19] = auVar18._0_8_;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_b0._M_elems[(long)iVar17 + -8];
        auVar32._8_8_ = 0;
        auVar32._0_8_ = edgeLength * dVar2;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = dVar1 * dVar5;
        auVar18 = vfmadd213sd_fma(auVar46,auVar32,auVar10);
        local_b0._M_elems[(long)iVar17 + -8] = auVar18._0_8_;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_130[iVar20];
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar1 * dVar6;
        auVar18 = vfmadd213sd_fma(auVar37,auVar32,auVar11);
        local_130[iVar20] = auVar18._0_8_;
      }
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_130[iVar19];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_b0._M_elems[(long)iVar17 + -8];
      auVar30._0_8_ =
           (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights[lVar24] / auVar29._0_8_;
      auVar30._8_8_ = 0;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_130[iVar17];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_b0._M_elems[iVar17];
      auVar29 = vfmadd213sd_fma(auVar34,auVar30,auVar12);
      local_b0._M_elems[iVar17] = auVar29._0_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_b0._M_elems[iVar19];
      auVar29 = vfmadd213sd_fma(auVar38,auVar30,auVar13);
      local_b0._M_elems[iVar19] = auVar29._0_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_130[iVar20];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_b0._M_elems[(long)iVar17 + 8];
      auVar29 = vfmadd213sd_fma(auVar43,auVar30,auVar14);
      local_b0._M_elems[(long)iVar17 + 8] = auVar29._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_b0._M_elems[iVar20];
      auVar29 = vfmadd213sd_fma(auVar39,auVar30,auVar15);
      local_b0._M_elems[iVar20] = auVar29._0_8_;
    }
    else {
      auVar29 = ZEXT816(0);
      pdVar25 = local_158;
      for (uVar26 = 0; uVar26 != (~((int)uVar16 >> 0x1f) & uVar16); uVar26 = uVar26 + 1) {
        dVar1 = categoryRates[uVar26];
        dVar2 = categoryWeights[uVar26];
        auVar33._8_8_ = 0;
        auVar33._0_8_ = dVar2;
        auVar40 = ZEXT864(0) << 0x40;
        for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
          auVar40 = ZEXT864((ulong)(auVar40._0_8_ + pdVar25[lVar21]));
        }
        pdVar27 = local_130;
        for (uVar28 = 0; uVar28 != 4; uVar28 = uVar28 + 1) {
          dVar3 = preOrderPartial[uVar28 | (uVar26 * lVar23 + lVar24) * 4];
          for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
            auVar47._8_8_ = 0;
            auVar47._0_8_ = pdVar27[lVar21];
            auVar42._8_8_ = 0;
            auVar42._0_8_ = dVar1 * edgeLength;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = dVar2 * dVar3;
            auVar18 = vfmadd231sd_fma(auVar47,auVar45,auVar42);
            pdVar27[lVar21] = auVar18._0_8_;
          }
          pdVar27 = pdVar27 + 4;
        }
        auVar29 = vfmadd231sd_fma(auVar29,auVar40._0_16_,auVar33);
        pdVar25 = pdVar25 + lVar23 * 4;
      }
      auVar29._0_8_ =
           (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights[lVar24] / auVar29._0_8_;
      auVar29._8_8_ = 0;
      for (lVar23 = 0; lVar23 != 0x10; lVar23 = lVar23 + 1) {
        auVar35._8_8_ = 0;
        auVar35._0_8_ = local_130[lVar23];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_b0._M_elems[lVar23];
        auVar18 = vfmadd213sd_fma(auVar35,auVar29,auVar18);
        local_b0._M_elems[lVar23] = auVar18._0_8_;
      }
    }
    local_158 = local_158 + 4;
  }
  for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 1) {
    outCrossProducts[lVar24] = local_b0._M_elems[lVar24] + outCrossProducts[lVar24];
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(const int *tipStates,
                                                                const REALTYPE *preOrderPartial,
                                                                const double *categoryRates,
                                                                const REALTYPE *categoryWeights,
                                                                const double edgeLength,
                                                                double *outCrossProducts,
                                                                double *outSumSquaredDerivatives) {
#ifdef OLD_CP_STATES
    return BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(tipStates, preOrderPartial, categoryRates,
            categoryWeights, edgeLength, outCrossProducts, outSumSquaredDerivatives);
#else
    std::array<REALTYPE, 16> acrossPatterns;
    acrossPatterns.fill((REALTYPE) 0);

    std::array<REALTYPE, 16> withinPattern;

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        withinPattern.fill((REALTYPE) 0);
        REALTYPE patternDenominator = 0.0;

        const int state = tipStates[pattern];

        if (state < kStateCount) {

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * 4;

                REALTYPE denominator = preOrderPartial[v + state];
                patternDenominator += denominator * weight;

                PREFETCH_PARTIALS(pre, preOrderPartial, v);

                withinPattern[0 * 4 + state] += ppre0 * weight * scale; // TODO Work with transpose(withinPattern)
                withinPattern[1 * 4 + state] += ppre1 * weight * scale;
                withinPattern[2 * 4 + state] += ppre2 * weight * scale;
                withinPattern[3 * 4 + state] += ppre3 * weight * scale;
            }

            const REALTYPE patternWeight = gPatternWeights[pattern] / patternDenominator;
            acrossPatterns[0 * 4 + state] += withinPattern[0 * 4 + state] * patternWeight;
            acrossPatterns[1 * 4 + state] += withinPattern[1 * 4 + state] * patternWeight;
            acrossPatterns[2 * 4 + state] += withinPattern[2 * 4 + state] * patternWeight;
            acrossPatterns[3 * 4 + state] += withinPattern[3 * 4 + state] * patternWeight;

        } else { // Missing character

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * 4;

                REALTYPE denominator = 0.0;
                for (int k = 0; k < 4; k++) {
                    denominator += preOrderPartial[v + k];
                }
                patternDenominator += denominator * weight;

                for (int k = 0; k < 4; k++) {
                    for (int j = 0; j < 4; j++) {
                        withinPattern[k * 4 + j] += preOrderPartial[v + k] * weight * scale;
                    }
                }
            }

            const REALTYPE patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < 16; k++) {
                acrossPatterns[k] += withinPattern[k] * patternWeight;
            }
        }
    }

    for (int k = 0; k < 16; k++) {
        outCrossProducts[k] += acrossPatterns[k]; // TODO transpose back on store
    }
#endif
}